

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Link.cpp
# Opt level: O3

void __thiscall TGenericLinker::~TGenericLinker(TGenericLinker *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TLinker).super_TShHandleBase._vptr_TShHandleBase =
       (_func_int **)&PTR__TGenericLinker_00927f60;
  pcVar2 = (this->infoSink).debug.sink._M_dataplus._M_p;
  paVar1 = &(this->infoSink).debug.sink.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->infoSink).info.sink._M_dataplus._M_p;
  paVar1 = &(this->infoSink).info.sink.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  TShHandleBase::~TShHandleBase((TShHandleBase *)this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

bool link(TCompilerList&, TUniformMap*) { return true; }